

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O3

unsigned_long __thiscall cli::Parser::get<unsigned_long>(Parser *this,string *name)

{
  pointer ppCVar1;
  pointer __s2;
  size_t __n;
  CmdBase *pCVar2;
  int iVar3;
  runtime_error *prVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer ppCVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  
  ppCVar7 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppCVar1 = (this->_commands).
            super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar7 != ppCVar1) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    do {
      pCVar2 = *ppCVar7;
      if ((pCVar2->name)._M_string_length == __n) {
        if (__n == 0) {
LAB_00106373:
          if (pCVar2->_vptr_CmdBase == (_func_int **)&PTR__CmdBase_00126b60) {
            return (unsigned_long)pCVar2[1]._vptr_CmdBase;
          }
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_70,"Invalid usage of the parameter ",name);
          pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_70," detected.");
          local_50 = (size_type *)(pbVar5->_M_dataplus)._M_p;
          paVar6 = &pbVar5->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50 == paVar6) {
            local_40 = paVar6->_M_allocated_capacity;
            uStack_38 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
            local_50 = &local_40;
          }
          else {
            local_40 = paVar6->_M_allocated_capacity;
          }
          local_48 = pbVar5->_M_string_length;
          (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
          pbVar5->_M_string_length = 0;
          (pbVar5->field_2)._M_local_buf[0] = '\0';
          std::runtime_error::runtime_error(prVar4,(string *)&local_50);
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar3 = bcmp((pCVar2->name)._M_dataplus._M_p,__s2,__n);
        if (iVar3 == 0) goto LAB_00106373;
      }
      ppCVar7 = ppCVar7 + 1;
    } while (ppCVar7 != ppCVar1);
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_70,"The parameter ",name);
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_70," could not be found.");
  local_50 = (size_type *)(pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50 == paVar6) {
    local_40 = paVar6->_M_allocated_capacity;
    uStack_38 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_50 = &local_40;
  }
  else {
    local_40 = paVar6->_M_allocated_capacity;
  }
  local_48 = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  std::runtime_error::runtime_error(prVar4,(string *)&local_50);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T get(const std::string& name) const {
			for (const auto& command : _commands) {
				if (command->name == name) {
					auto cmd = dynamic_cast<CmdArgument<T>*>(command);

					if (cmd == nullptr) {
						throw std::runtime_error("Invalid usage of the parameter " + name + " detected.");
					}

					return cmd->value;
				}
			}

			throw std::runtime_error("The parameter " + name + " could not be found.");
		}